

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteGroupMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  undefined4 uVar1;
  CodedOutputStream *in_RDX;
  long *in_RSI;
  int in_EDI;
  int size;
  uint32 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffc0;
  CodedOutputStream *value_00;
  
  value_00 = in_RDX;
  MakeTag(in_EDI,WIRETYPE_START_GROUP);
  io::CodedOutputStream::WriteTag(in_RDX,in_stack_ffffffffffffffac);
  uVar1 = (**(code **)(*in_RSI + 0x60))();
  WriteSubMessageMaybeToArray
            ((int)((ulong)in_RSI >> 0x20),(MessageLite *)value_00,
             (CodedOutputStream *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  MakeTag(in_EDI,WIRETYPE_END_GROUP);
  io::CodedOutputStream::WriteTag(in_RDX,in_stack_ffffffffffffffac);
  return;
}

Assistant:

void WireFormatLite::WriteGroupMaybeToArray(int field_number,
                                            const MessageLite& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  const int size = value.GetCachedSize();
  WriteSubMessageMaybeToArray(size, value, output);
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}